

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O0

void __thiscall KDReports::Test::testEndlessPrinter(Test *this)

{
  byte bVar1;
  int iVar2;
  QColor local_a8;
  int local_98;
  int i;
  QArrayDataPointer<char16_t> local_88;
  QString local_70;
  TextElement local_58 [8];
  TextElement elem;
  Report local_40 [8];
  Report report;
  Test *this_local;
  char16_t *str;
  
  KDReports::Report::Report(local_40,(QObject *)0x0);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_88,(Data *)0x0,L"foo",3);
  QString::QString(&local_70,&local_88);
  KDReports::TextElement::TextElement(local_58,(QString *)&local_70);
  QString::~QString(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  for (local_98 = 0; local_98 < 400; local_98 = local_98 + 1) {
    QColor::QColor(&local_a8);
    KDReports::Report::addElement(local_40,local_58,1,&local_a8);
  }
  KDReports::Report::setWidthForEndlessPrinter(114.0);
  iVar2 = KDReports::Report::numberOfPages();
  bVar1 = QTest::qCompare(iVar2,1,"report.numberOfPages()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                          ,0x5a);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::setWidthForEndlessPrinter(0.0);
    KDReports::Report::setPageSize((PageSizeId)local_40);
    iVar2 = KDReports::Report::numberOfPages();
    QTest::qVerify(1 < iVar2,"report.numberOfPages() > 1","",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                   ,0x5e);
  }
  KDReports::TextElement::~TextElement(local_58);
  KDReports::Report::~Report(local_40);
  return;
}

Assistant:

void testEndlessPrinter()
    {
        Report report;
        TextElement elem(QStringLiteral("foo"));
        for (int i = 0; i < 400; ++i) {
            report.addElement(elem);
        }
        report.setWidthForEndlessPrinter(114.0);
        QCOMPARE(report.numberOfPages(), 1);
        // Switching back to normal pagination
        report.setWidthForEndlessPrinter(0);
        report.setPageSize(QPageSize::A6);
        QVERIFY(report.numberOfPages() > 1);
    }